

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O2

ADAPTER_VENDOR Diligent::VendorIdToAdapterVendor(Uint32 VendorId)

{
  if (VendorId == 0x1002) {
    return ADAPTER_VENDOR_AMD;
  }
  if (VendorId == 0x1010) {
    return ADAPTER_VENDOR_IMGTECH;
  }
  if (VendorId == 0x106b) {
    return ADAPTER_VENDOR_APPLE;
  }
  if (VendorId == 0x10005) {
    return ADAPTER_VENDOR_MESA;
  }
  if (VendorId == 0x13b5) {
    return ADAPTER_VENDOR_ARM;
  }
  if (VendorId == 0x1414) {
    return ADAPTER_VENDOR_MSFT;
  }
  if (VendorId == 0x14e4) {
    return ADAPTER_VENDOR_BROADCOM;
  }
  if (VendorId != 0x5143) {
    if (VendorId == 0x8086) {
      return ADAPTER_VENDOR_INTEL;
    }
    if (VendorId == 0x10de) {
      return ADAPTER_VENDOR_NVIDIA;
    }
    return ADAPTER_VENDOR_UNKNOWN;
  }
  return ADAPTER_VENDOR_QUALCOMM;
}

Assistant:

ADAPTER_VENDOR VendorIdToAdapterVendor(Uint32 VendorId)
{
    static_assert(ADAPTER_VENDOR_LAST == 10, "Please update the switch below to handle the new adapter type");
    switch (VendorId)
    {
#define VENDOR_ID_TO_VENDOR(Name) \
    case ADAPTER_VENDOR_ID_##Name: return ADAPTER_VENDOR_##Name

        VENDOR_ID_TO_VENDOR(AMD);
        VENDOR_ID_TO_VENDOR(NVIDIA);
        VENDOR_ID_TO_VENDOR(INTEL);
        VENDOR_ID_TO_VENDOR(ARM);
        VENDOR_ID_TO_VENDOR(QUALCOMM);
        VENDOR_ID_TO_VENDOR(IMGTECH);
        VENDOR_ID_TO_VENDOR(MSFT);
        VENDOR_ID_TO_VENDOR(APPLE);
        VENDOR_ID_TO_VENDOR(MESA);
        VENDOR_ID_TO_VENDOR(BROADCOM);
#undef VENDOR_ID_TO_VENDOR

        default:
            return ADAPTER_VENDOR_UNKNOWN;
    }
}